

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

void SVGChart::MakeExamplePlot8(PPlot *ioPPlot)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  PPlot *pPVar3;
  PlotDataBase *inXData;
  PlotDataBase *inYData;
  LegendData *inLegendData;
  PlotDataSelection *inPlotDataSelection;
  int theI;
  int iVar4;
  float fVar5;
  double dVar6;
  float local_40;
  float local_3c;
  PPlot *local_38;
  
  iVar4 = 0;
  local_38 = ioPPlot;
  std::__cxx11::string::_M_replace
            ((ulong)&(ioPPlot->mPlotBackground).mTitle,0,
             (char *)(ioPPlot->mPlotBackground).mTitle._M_string_length,0x10d478);
  inXData = (PlotDataBase *)operator_new(0x20);
  inXData->_vptr_PlotDataBase = (_func_int **)0x0;
  inXData[1]._vptr_PlotDataBase = (_func_int **)0x0;
  inXData[2]._vptr_PlotDataBase = (_func_int **)0x0;
  inXData[3]._vptr_PlotDataBase = (_func_int **)0x0;
  inXData->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  inYData = (PlotDataBase *)operator_new(0x20);
  inYData->_vptr_PlotDataBase = (_func_int **)0x0;
  inYData[1]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[2]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[3]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  dVar6 = 0.0;
  do {
    local_3c = (float)(dVar6 * 0.001);
    iVar2._M_current = (float *)inXData[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar2._M_current == inXData[3]._vptr_PlotDataBase) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(inXData + 1),iVar2,&local_3c);
    }
    else {
      *iVar2._M_current = local_3c;
      inXData[2]._vptr_PlotDataBase = (_func_int **)(iVar2._M_current + 1);
    }
    fVar5 = (float)iVar4;
    local_40 = fVar5 * 0.0001 * fVar5 * fVar5 + 0.01;
    iVar2._M_current = (float *)inYData[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar2._M_current == inYData[3]._vptr_PlotDataBase) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(inYData + 1),iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      inYData[2]._vptr_PlotDataBase = (_func_int **)(iVar2._M_current + 1);
    }
    dVar6 = dVar6 + 1.0;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0xb);
  inLegendData = (LegendData *)operator_new(0xa8);
  (inLegendData->mName)._M_dataplus._M_p = (pointer)&(inLegendData->mName).field_2;
  (inLegendData->mName)._M_string_length = 0;
  (inLegendData->mName).field_2._M_local_buf[0] = '\0';
  (inLegendData->mColor).mR = '\0';
  (inLegendData->mColor).mG = '\0';
  (inLegendData->mColor).mB = '\0';
  inLegendData->mShow = true;
  (inLegendData->mStyle).mFontSize = 10;
  (inLegendData->mStyle).mFont._M_dataplus._M_p = (pointer)&(inLegendData->mStyle).mFont.field_2;
  (inLegendData->mStyle).mFont._M_string_length = 0;
  (inLegendData->mStyle).mFont.field_2._M_local_buf[0] = '\0';
  (inLegendData->mStyle).mPenWidth = 1;
  (inLegendData->mStyle).mPenStyle._M_dataplus._M_p =
       (pointer)&(inLegendData->mStyle).mPenStyle.field_2;
  (inLegendData->mStyle).mPenStyle._M_string_length = 0;
  (inLegendData->mStyle).mPenStyle.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header;
  (inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (inLegendData->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_replace((ulong)inLegendData,0,(char *)0x0,0x10d434);
  (inLegendData->mColor).mR = 'd';
  (inLegendData->mColor).mG = 'd';
  (inLegendData->mColor).mB = 200;
  inPlotDataSelection = (PlotDataSelection *)operator_new(0x18);
  pPVar3 = local_38;
  (inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  PlotDataContainer::AddXYPlot
            (&local_38->mPlotDataContainer,inXData,inYData,inLegendData,(DataDrawerBase *)0x0,
             inPlotDataSelection);
  (pPVar3->mMargins).mLeft = 0x32;
  (pPVar3->mMargins).mTop = 0x32;
  return;
}

Assistant:

void MakeExamplePlot8 (PPlot &ioPPlot) {

      ioPPlot.mPlotBackground.mTitle = "data selection and editing";
      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (int theI=0;theI<=10;theI++) {
        theX1->push_back (0.001*theI);
        theY1->push_back (0.01+theFac*theI*theI*theI);
      }
      LegendData *theLegend = new LegendData ();
      theLegend->mName = "foo";
      theLegend->mColor = PColor (100,100,200);

      PlotDataSelection *thePlotDataSelection = new PlotDataSelection ();
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, theLegend, nullptr, thePlotDataSelection);
      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 50;

    }